

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

void __thiscall soplex::SoPlexBase<double>::_addColReal(SoPlexBase<double> *this,LPColReal *lpcol)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  SPxLPBase<double> *pSVar4;
  VarStatus *pVVar5;
  LPColReal *ctx;
  
  pSVar4 = this->_realLP;
  ctx = lpcol;
  (*(pSVar4->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[10])
            (pSVar4,lpcol,(ulong)pSVar4->_isScaled);
  if (this->_isRealLPLoaded == true) {
    this->_hasBasis = NO_PROBLEM < (this->_solver).super_SPxBasisBase<double>.thestatus;
  }
  else if (this->_hasBasis == true) {
    dVar1 = this->_currentSettings->_realParamValues[6];
    if (lpcol->low <= -dVar1) {
      dVar2 = lpcol->up;
      uVar3 = (this->_basisStatusCols).thesize;
      ctx = (LPColReal *)(ulong)uVar3;
      DataArray<soplex::SPxSolverBase<double>::VarStatus>::insert(&this->_basisStatusCols,uVar3,1);
      pVVar5 = (this->_basisStatusCols).data;
      if (dVar1 <= dVar2) {
        pVVar5[(int)uVar3] = ZERO;
      }
      else {
        pVVar5[(int)uVar3] = ON_UPPER;
      }
    }
    else {
      uVar3 = (this->_basisStatusCols).thesize;
      ctx = (LPColReal *)(ulong)uVar3;
      DataArray<soplex::SPxSolverBase<double>::VarStatus>::insert(&this->_basisStatusCols,uVar3,1);
      (this->_basisStatusCols).data[(int)uVar3] = ON_LOWER;
    }
  }
  if ((this->_rationalLUSolver).super_CLUFactorRational.stat == UNLOADED) {
    return;
  }
  SLUFactorRational::init(&this->_rationalLUSolver,(EVP_PKEY_CTX *)ctx);
  return;
}

Assistant:

void SoPlexBase<R>::_addColReal(const LPColReal& lpcol)
{
   assert(_realLP != nullptr);

   bool scale = _realLP->isScaled();
   _realLP->addCol(lpcol, scale);

   if(_isRealLPLoaded)
      _hasBasis = (_solver.basis().status() > SPxBasisBase<R>::NO_PROBLEM);
   else if(_hasBasis)
   {
      if(lpcol.lower() > -realParam(SoPlexBase<R>::INFTY))
         _basisStatusCols.append(SPxSolverBase<R>::ON_LOWER);
      else if(lpcol.upper() < realParam(SoPlexBase<R>::INFTY))
         _basisStatusCols.append(SPxSolverBase<R>::ON_UPPER);
      else
         _basisStatusCols.append(SPxSolverBase<R>::ZERO);
   }

   _rationalLUSolver.clear();
}